

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildWithQueryDepsLogTest::SetUp(BuildWithQueryDepsLogTest *this)

{
  Test *pTVar1;
  bool bVar2;
  string err;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  BuildTest::SetUp(&this->super_BuildTest);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"BuildWithQueryDepsLogTest",(allocator<char> *)&local_40);
  ScopedTempDir::CreateAndEnter(&this->temp_dir_,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pTVar1 = g_current_test;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"ninja_deps",&local_61);
  bVar2 = DepsLog::OpenForWrite(&this->log_,&local_40,&local_60);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x761,"log_.OpenForWrite(\"ninja_deps\", &err)");
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = g_current_test;
  if (bVar2) {
    bVar2 = std::operator==("",&local_60);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x762,"\"\" == err");
    if (bVar2) goto LAB_001342a8;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_001342a8:
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

virtual void SetUp() {
    BuildTest::SetUp();

    temp_dir_.CreateAndEnter("BuildWithQueryDepsLogTest");

    std::string err;
    ASSERT_TRUE(log_.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);
  }